

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ranges.c
# Opt level: O2

int quicly_ranges_subtract(quicly_ranges_t *ranges,uint64_t start,uint64_t end)

{
  size_t sVar1;
  quicly_range_t *pqVar2;
  ulong uVar3;
  ulong *puVar4;
  long lVar5;
  int iVar6;
  size_t slot;
  size_t sVar7;
  size_t start_00;
  ulong end_00;
  ulong *puVar8;
  long lVar9;
  
  if (end <= start) {
    __assert_fail("start < end",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/windrunner414[P]quicly/lib/ranges.c"
                  ,0x78,"int quicly_ranges_subtract(quicly_ranges_t *, uint64_t, uint64_t)");
  }
  sVar1 = ranges->num_ranges;
  if (sVar1 == 0) {
    return 0;
  }
  pqVar2 = ranges->ranges;
  if (end <= pqVar2->start) {
    return 0;
  }
  if (pqVar2[sVar1 - 1].end <= start) {
    return 0;
  }
  slot = 0;
  lVar5 = 0;
  do {
    lVar9 = lVar5;
    start_00 = slot;
    end_00 = *(ulong *)((long)&pqVar2->end + lVar9);
    slot = start_00 + 1;
    lVar5 = lVar9 + 0x10;
  } while (end_00 < start);
  puVar4 = (ulong *)((long)&pqVar2[1].start + lVar9);
  uVar3 = *(ulong *)((long)&pqVar2->start + lVar9);
  if (end_00 < end) {
    if (uVar3 < start) {
      *(uint64_t *)((long)&pqVar2->end + lVar9) = start;
      start_00 = slot;
    }
    do {
      puVar8 = puVar4;
      sVar7 = slot;
      slot = sVar1;
      if ((sVar1 == sVar7) || (slot = sVar7, end <= *puVar8)) goto LAB_0011c30a;
      slot = sVar7 + 1;
      puVar4 = puVar8 + 2;
    } while (puVar8[1] <= end);
    *puVar8 = end;
    slot = sVar7;
LAB_0011c30a:
    if (start_00 == slot) {
      return 0;
    }
  }
  else {
    if (end <= uVar3) {
      return 0;
    }
    if (uVar3 < start) {
      if (end_00 != end) {
        iVar6 = insert_at(ranges,end,end_00,slot);
        if (iVar6 != 0) {
          return -1;
        }
        *(uint64_t *)((long)&ranges->ranges->end + lVar9) = start;
        return 0;
      }
      *(uint64_t *)((long)&pqVar2->end + lVar9) = start;
      end = uVar3;
      end_00 = start;
    }
    else {
      puVar4[-2] = end;
    }
    if (end != end_00) {
      return 0;
    }
  }
  quicly_ranges_shrink(ranges,start_00,slot);
  return 0;
}

Assistant:

int quicly_ranges_subtract(quicly_ranges_t *ranges, uint64_t start, uint64_t end)
{
    size_t shrink_from, slot;

    assert(start < end);

    if (ranges->num_ranges == 0) {
        return 0;
    } else if (end <= ranges->ranges[0].start) {
        return 0;
    } else if (ranges->ranges[ranges->num_ranges - 1].end <= start) {
        return 0;
    }

    /* find the first overlapping slot */
    for (slot = 0; ranges->ranges[slot].end < start; ++slot)
        ;

    if (end <= ranges->ranges[slot].end) {
        /* first overlapping slot is the only slot that we will ever modify */
        if (end <= ranges->ranges[slot].start)
            return 0;
        if (start <= ranges->ranges[slot].start) {
            ranges->ranges[slot].start = end;
        } else if (end == ranges->ranges[slot].end) {
            ranges->ranges[slot].end = start;
        } else {
            /* split */
            if (insert_at(ranges, end, ranges->ranges[slot].end, slot + 1) != 0)
                return -1;
            ranges->ranges[slot].end = start;
            return 0;
        }
        /* remove the slot if the range has become empty */
        if (ranges->ranges[slot].start == ranges->ranges[slot].end)
            quicly_ranges_shrink(ranges, slot, slot + 1);
        return 0;
    }

    /* specified region covers multiple slots */
    if (start <= ranges->ranges[slot].start) {
        shrink_from = slot;
    } else {
        ranges->ranges[slot].end = start;
        shrink_from = slot + 1;
    }

    /* find the last overlapping slot */
    for (++slot; slot != ranges->num_ranges; ++slot) {
        if (end <= ranges->ranges[slot].start)
            break;
        if (end < ranges->ranges[slot].end) {
            ranges->ranges[slot].start = end;
            break;
        }
    }

    /* remove shrink_from..slot */
    if (shrink_from != slot)
        quicly_ranges_shrink(ranges, shrink_from, slot);

    return 0;
}